

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetCodeGenerator.cc
# Opt level: O2

void __thiscall
flow::TargetCodeGenerator::changeStack(TargetCodeGenerator *this,size_t pops,Value *pushValue)

{
  if (pops != 0) {
    pop(this,pops);
  }
  if (pushValue != (Value *)0x0) {
    push(this,pushValue);
    return;
  }
  return;
}

Assistant:

void TargetCodeGenerator::changeStack(size_t pops, const Value* pushValue) {
  if (pops)
    pop(pops);

  if (pushValue)
    push(pushValue);
}